

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

TexDictionary * rw::TexDictionary::create(void)

{
  LLLink *pLVar1;
  FILE *__stream;
  TexDictionary *object;
  LLLink *pLVar2;
  char *pcVar3;
  Error _e;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp line: 113"
  ;
  object = (TexDictionary *)(*Engine::memfuncs)((long)(int)s_plglist,0x30016);
  if (object == (TexDictionary *)0x0) {
    _e.plugin = 0;
    _e.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/texture.cpp"
            ,0x73);
    __stream = _stderr;
    pcVar3 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar3);
    setError(&_e);
  }
  else {
    numAllocated = numAllocated + 1;
    (object->object).type = '\x06';
    (object->object).subType = '\0';
    (object->object).flags = '\0';
    (object->object).privateFlags = '\0';
    (object->object).parent = (void *)0x0;
    (object->textures).link.next = &(object->textures).link;
    (object->textures).link.prev = &(object->textures).link;
    pLVar2 = (LLLink *)(engine + textureModuleOffset + 0x20);
    pLVar1 = pLVar2->next;
    (object->inGlobalList).next = pLVar1;
    (object->inGlobalList).prev = pLVar2;
    pLVar1->prev = &object->inGlobalList;
    pLVar2->next = &object->inGlobalList;
    PluginList::construct((PluginList *)&s_plglist,object);
  }
  return object;
}

Assistant:

TexDictionary*
TexDictionary::create(void)
{
	TexDictionary *dict = (TexDictionary*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_TEXDICTIONARY);
	if(dict == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	dict->object.init(TexDictionary::ID, 0);
	dict->textures.init();
	TEXTUREGLOBAL(texDicts).add(&dict->inGlobalList);
	s_plglist.construct(dict);
	return dict;
}